

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockNodeUpdateFlagsAndCollapse(ImGuiDockNode *node)

{
  ImGuiDockNode *pIVar1;
  ImGuiWindow *window;
  bool bVar2;
  bool bVar3;
  ImGuiContext *pIVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  byte bVar12;
  
  pIVar4 = GImGui;
  pIVar1 = node->ParentNode;
  if (pIVar1 != (ImGuiDockNode *)0x0) {
    if ((pIVar1->ChildNodes[0] != node) && (pIVar1->ChildNodes[1] != node)) {
      __assert_fail("node->ParentNode == __null || node->ParentNode->ChildNodes[0] == node || node->ParentNode->ChildNodes[1] == node"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x35c1,"void ImGui::DockNodeUpdateFlagsAndCollapse(ImGuiDockNode *)");
    }
    node->SharedFlags = pIVar1->SharedFlags;
  }
  node->field_0xbd = node->field_0xbd & 0xdf;
  if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
    DockNodeUpdateFlagsAndCollapse(node->ChildNodes[0]);
  }
  if (node->ChildNodes[1] != (ImGuiDockNode *)0x0) {
    DockNodeUpdateFlagsAndCollapse(node->ChildNodes[1]);
  }
  node->LocalFlagsInWindows = 0;
  iVar5 = (node->Windows).Size;
  if (iVar5 < 1) {
    uVar6 = 0;
  }
  else {
    uVar8 = 0;
    do {
      window = (node->Windows).Data[uVar8];
      if (window->DockNode != node) {
        __assert_fail("window->DockNode == node",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x35d7,"void ImGui::DockNodeUpdateFlagsAndCollapse(ImGuiDockNode *)");
      }
      if (node->LastFrameActive + 1 == pIVar4->FrameCount) {
        bVar2 = window->LastFrameActive < node->LastFrameActive;
        if ((((node->field_0xbd & 0x40) != 0) || (bVar3 = false, node->WantCloseTabId == window->ID)
            ) && (bVar3 = false, window->HasCloseButton == true)) {
          bVar3 = (window->Flags & 0x100000) == 0;
        }
      }
      else {
        bVar2 = false;
        bVar3 = false;
      }
      if ((bVar2 || bVar3) || ((byte)window->field_0x3e1 >> 3 & 1) != 0) {
        window->field_0x3e1 = window->field_0x3e1 & 0xf7;
        if (((node->Windows).Size == 1) && ((node->MergedFlags & 0x800) == 0)) {
          DockNodeHideHostWindow(node);
          node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
          DockNodeRemoveWindow(node,window,node->ID);
          return;
        }
        DockNodeRemoveWindow(node,window,node->ID);
        iVar5 = (node->Windows).Size;
      }
      else {
        node->LocalFlagsInWindows =
             node->LocalFlagsInWindows | (window->WindowClass).DockNodeFlagsOverrideSet;
        uVar8 = (ulong)((int)uVar8 + 1);
      }
    } while ((int)uVar8 < iVar5);
    uVar6 = node->LocalFlagsInWindows;
  }
  uVar7 = node->LocalFlags;
  uVar6 = uVar6 | node->SharedFlags;
  uVar11 = uVar6 | uVar7;
  node->MergedFlags = uVar11;
  bVar10 = node->field_0xbe;
  bVar12 = bVar10;
  if (((bVar10 & 2) != 0) && (bVar12 = bVar10 | 4, (uVar11 & 0x2040) != 0x40 || iVar5 != 1)) {
    bVar12 = bVar10;
  }
  bVar9 = bVar12 & 0xfd;
  node->field_0xbe = bVar9;
  bVar10 = bVar9;
  if ((((bVar12 & 4) != 0) && (node->VisibleWindow != (ImGuiWindow *)0x0)) &&
     (bVar10 = bVar12 & 0xf9,
     ((node->VisibleWindow->WindowClass).DockNodeFlagsOverrideSet & 0x2000) == 0)) {
    bVar10 = bVar9;
  }
  if (iVar5 < 2) {
    if ((bVar10 & 4) == 0) goto LAB_0014bc9d;
    uVar7 = uVar7 ^ 0x2000;
  }
  else {
    uVar7 = uVar7 & 0xffffdfff;
  }
  node->LocalFlags = uVar7;
  node->MergedFlags = uVar6 | uVar7;
LAB_0014bc9d:
  node->field_0xbe = bVar10 & 0xf9;
  DockNodeUpdateVisibleFlag(node);
  return;
}

Assistant:

static void ImGui::DockNodeUpdateFlagsAndCollapse(ImGuiDockNode* node)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(node->ParentNode == NULL || node->ParentNode->ChildNodes[0] == node || node->ParentNode->ChildNodes[1] == node);

    // Inherit most flags
    if (node->ParentNode)
        node->SharedFlags = node->ParentNode->SharedFlags & ImGuiDockNodeFlags_SharedFlagsInheritMask_;

    // Recurse into children
    // There is the possibility that one of our child becoming empty will delete itself and moving its sibling contents into 'node'.
    // If 'node->ChildNode[0]' delete itself, then 'node->ChildNode[1]->Windows' will be moved into 'node'
    // If 'node->ChildNode[1]' delete itself, then 'node->ChildNode[0]->Windows' will be moved into 'node' and the "remove inactive windows" loop will have run twice on those windows (harmless)
    node->HasCentralNodeChild = false;
    if (node->ChildNodes[0])
        DockNodeUpdateFlagsAndCollapse(node->ChildNodes[0]);
    if (node->ChildNodes[1])
        DockNodeUpdateFlagsAndCollapse(node->ChildNodes[1]);

    // Remove inactive windows, collapse nodes
    // Merge node flags overrides stored in windows
    node->LocalFlagsInWindows = ImGuiDockNodeFlags_None;
    for (int window_n = 0; window_n < node->Windows.Size; window_n++)
    {
        ImGuiWindow* window = node->Windows[window_n];
        IM_ASSERT(window->DockNode == node);

        bool node_was_active = (node->LastFrameActive + 1 == g.FrameCount);
        bool remove = false;
        remove |= node_was_active && (window->LastFrameActive + 1 < g.FrameCount);
        remove |= node_was_active && (node->WantCloseAll || node->WantCloseTabId == window->ID) && window->HasCloseButton && !(window->Flags & ImGuiWindowFlags_UnsavedDocument);  // Submit all _expected_ closure from last frame
        remove |= (window->DockTabWantClose);
        if (remove)
        {
            window->DockTabWantClose = false;
            if (node->Windows.Size == 1 && !node->IsCentralNode())
            {
                DockNodeHideHostWindow(node);
                node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
                DockNodeRemoveWindow(node, window, node->ID); // Will delete the node so it'll be invalid on return
                return;
            }
            DockNodeRemoveWindow(node, window, node->ID);
            window_n--;
            continue;
        }

        // FIXME-DOCKING: Missing policies for conflict resolution, hence the "Experimental" tag on this.
        //node->LocalFlagsInWindow &= ~window->WindowClass.DockNodeFlagsOverrideClear;
        node->LocalFlagsInWindows |= window->WindowClass.DockNodeFlagsOverrideSet;
    }
    node->UpdateMergedFlags();

    // Auto-hide tab bar option
    ImGuiDockNodeFlags node_flags = node->MergedFlags;
    if (node->WantHiddenTabBarUpdate && node->Windows.Size == 1 && (node_flags & ImGuiDockNodeFlags_AutoHideTabBar) && !node->IsHiddenTabBar())
        node->WantHiddenTabBarToggle = true;
    node->WantHiddenTabBarUpdate = false;

    // Cancel toggling if we know our tab bar is enforced to be hidden at all times
    if (node->WantHiddenTabBarToggle && node->VisibleWindow && (node->VisibleWindow->WindowClass.DockNodeFlagsOverrideSet & ImGuiDockNodeFlags_HiddenTabBar))
        node->WantHiddenTabBarToggle = false;

    // Apply toggles at a single point of the frame (here!)
    if (node->Windows.Size > 1)
        node->SetLocalFlags(node->LocalFlags & ~ImGuiDockNodeFlags_HiddenTabBar);
    else if (node->WantHiddenTabBarToggle)
        node->SetLocalFlags(node->LocalFlags ^ ImGuiDockNodeFlags_HiddenTabBar);
    node->WantHiddenTabBarToggle = false;

    DockNodeUpdateVisibleFlag(node);
}